

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::ResourceBundle::getNextString
          (UnicodeString *__return_storage_ptr__,ResourceBundle *this,UErrorCode *status)

{
  ConstChar16Ptr local_38;
  UChar *local_30;
  UChar *r;
  UErrorCode *pUStack_20;
  int32_t len;
  UErrorCode *status_local;
  ResourceBundle *this_local;
  
  r._4_4_ = 0;
  pUStack_20 = status;
  status_local = (UErrorCode *)this;
  this_local = (ResourceBundle *)__return_storage_ptr__;
  local_30 = ures_getNextString_63(this->fResource,(int32_t *)((long)&r + 4),(char **)0x0,status);
  ConstChar16Ptr::ConstChar16Ptr(&local_38,local_30);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_38,r._4_4_);
  ConstChar16Ptr::~ConstChar16Ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceBundle::getNextString(UErrorCode& status) {
    int32_t len = 0;
    const UChar* r = ures_getNextString(fResource, &len, 0, &status);
    return UnicodeString(TRUE, r, len);
}